

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  void *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s1;
  long lVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  pointer pcVar9;
  size_type __n;
  _anonymous_namespace_ *p_Var10;
  FileDescriptor *in_R8;
  AlphaNum *in_R9;
  ulong uVar11;
  char *__end;
  string_view name;
  string_view classname;
  string_view name_00;
  string_view classname_00;
  string segment;
  string result;
  size_type __dnew;
  long *local_158;
  php *local_150;
  long local_148 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _anonymous_namespace_ *local_118;
  undefined1 local_110 [48];
  string local_e0;
  undefined1 local_c0 [48];
  AlphaNum local_90;
  AlphaNum local_60;
  
  __s = (void *)**(undefined8 **)(this + 8);
  uVar8 = (*(undefined8 **)(this + 8))[1];
  local_118 = this;
  if (uVar8 == 0) {
    uVar7 = 0xffffffff;
  }
  else {
    pvVar3 = memchr(__s,0x2f,uVar8);
    uVar7 = (int)pvVar3 - (int)__s;
    options = (Options *)(ulong)uVar7;
    uVar7 = -(uint)(pvVar3 == (void *)0x0) | uVar7;
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,anon_var_dwarf_a12c75 + 5,anon_var_dwarf_a12c75 + 5,options);
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,anon_var_dwarf_a12c75 + 5,anon_var_dwarf_a12c75 + 5);
  if ((uVar8 == 0x1b) && (iVar2 = bcmp(__s,"google/protobuf/empty.proto",0x1b), iVar2 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_110._0_8_ = &DAT_00000028;
    pcVar4 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)__return_storage_ptr__,(ulong)local_110);
LAB_00e3b6c1:
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_110._0_8_;
    builtin_strncpy(pcVar4,"GPBMetadata/Google/Protobuf/GPBEmpty.php",0x28);
  }
  else {
    if ((file->super_SymbolBase).symbol_type_ != '\x01') {
      uVar11 = uVar8;
      if (uVar8 == 0) {
        uVar11 = 0xffffffffffffffff;
      }
      else {
        do {
          uVar5 = uVar11 - 1;
          if (uVar11 == 0) {
            uVar5 = 0xffffffffffffffff;
            break;
          }
          lVar1 = uVar11 - 1;
          uVar11 = uVar5;
        } while (*(char *)((long)__s + lVar1) != '.');
        uVar11 = (ulong)(int)uVar5;
      }
      if ((uVar8 != 0x1b) || (iVar2 = bcmp(__s,"google/protobuf/empty.proto",0x1b), iVar2 != 0)) {
        if (uVar8 < uVar11) {
          uVar11 = uVar8;
        }
        if ((*(byte *)(*(long *)(local_118 + 0x80) + 0x29) & 1) == 0) {
          local_110._0_8_ = &DAT_0000000c;
          local_110._8_8_ = "GPBMetadata/";
          absl::lts_20250127::StrAppend(&local_138,(AlphaNum *)local_110);
          if (uVar7 != 0xffffffff) {
            iVar2 = 0;
            do {
              uVar8 = (ulong)iVar2;
              if (uVar11 < uVar8) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar8,uVar11);
              }
              name._M_str._0_4_ = uVar7 - iVar2;
              p_Var10 = (_anonymous_namespace_ *)(long)(int)name._M_str;
              if ((_anonymous_namespace_ *)(uVar11 - uVar8) <
                  (_anonymous_namespace_ *)(long)(int)name._M_str) {
                p_Var10 = (_anonymous_namespace_ *)(uVar11 - uVar8);
              }
              name._M_len = uVar8 + (long)__s;
              name._M_str._4_4_ = 0;
              UnderscoresToCamelCase_abi_cxx11_((string *)local_110,p_Var10,name,SUB81(in_R8,0));
              std::__cxx11::string::operator=((string *)&local_158,(string *)local_110);
              if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
                operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
              }
              classname._M_str = (char *)local_118;
              classname._M_len = (size_t)local_158;
              ReservedNamePrefix_abi_cxx11_((string *)local_c0,local_150,classname,in_R8);
              local_110._0_8_ = local_c0._8_8_;
              local_110._8_8_ = local_c0._0_8_;
              local_60.piece_._M_len = (size_t)local_150;
              local_60.piece_._M_str = (char *)local_158;
              local_90.piece_._M_len = 1;
              local_90.piece_._M_str = "/";
              absl::lts_20250127::StrAppend(&local_138,(AlphaNum *)local_110,&local_60,&local_90);
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
              iVar2 = uVar7 + 1;
              uVar8 = (ulong)iVar2;
              uVar7 = 0xffffffff;
              if (uVar8 <= uVar11 && uVar11 - uVar8 != 0) {
                pvVar3 = memchr((void *)(uVar8 + (long)__s),0x2f,uVar11 - uVar8);
                uVar7 = -(uint)(pvVar3 == (void *)0x0) | (int)pvVar3 - (int)__s;
              }
            } while (uVar7 != 0xffffffff);
            uVar7 = 0xffffffff;
          }
        }
        else {
          puVar6 = (undefined8 *)
                   (*(ulong *)(*(long *)(local_118 + 0x80) + 0x88) & 0xfffffffffffffffc);
          pcVar4 = (char *)puVar6[1];
          if ((pcVar4 != (char *)0x0) &&
             ((__s1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6, pcVar4 != (char *)0x1 || (iVar2 = bcmp(__s1,"\\",1), iVar2 != 0)))
             ) {
            local_110._0_8_ = pcVar4;
            local_110._8_8_ = __s1;
            absl::lts_20250127::StrAppend(&local_138,(AlphaNum *)local_110);
            if ((pointer)local_138._M_string_length != (pointer)0x0) {
              pcVar9 = (pointer)0x0;
              do {
                if (local_138._M_dataplus._M_p[(long)pcVar9] == '\\') {
                  local_138._M_dataplus._M_p[(long)pcVar9] = '/';
                }
                pcVar9 = pcVar9 + 1;
              } while ((pointer)local_138._M_string_length != pcVar9);
            }
            if ((pointer)local_138._M_string_length == (pointer)0x0) {
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
            }
            if (local_138._M_dataplus._M_p[(long)(local_138._M_string_length + -1)] != '/') {
              local_110._0_8_ = (char *)0x1;
              local_110._8_8_ = "/";
              absl::lts_20250127::StrAppend(&local_138,(AlphaNum *)local_110);
            }
          }
        }
        uVar8 = uVar11;
        if (uVar11 == 0) {
LAB_00e3b579:
          uVar5 = 0xffffffffffffffff;
        }
        else {
          do {
            uVar5 = uVar8 - 1;
            if (uVar8 == 0) goto LAB_00e3b579;
            lVar1 = uVar8 - 1;
            uVar8 = uVar5;
          } while (*(char *)((long)__s + lVar1) != '/');
        }
        name_00._M_str._0_4_ = (int)uVar5 + 1;
        iVar2 = 0;
        if ((int)uVar5 != -1) {
          iVar2 = (int)name_00._M_str;
        }
        uVar8 = (ulong)iVar2;
        if (uVar11 < uVar8) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar8,uVar11);
        }
        p_Var10 = (_anonymous_namespace_ *)(long)(int)(uVar7 - iVar2);
        if ((_anonymous_namespace_ *)(uVar11 - uVar8) <
            (_anonymous_namespace_ *)(long)(int)(uVar7 - iVar2)) {
          p_Var10 = (_anonymous_namespace_ *)(uVar11 - uVar8);
        }
        name_00._M_len = (long)__s + uVar8;
        name_00._M_str._4_4_ = 0;
        UnderscoresToCamelCase_abi_cxx11_((string *)local_110,p_Var10,name_00,SUB81(in_R8,0));
        std::__cxx11::string::operator=((string *)&local_158,(string *)local_110);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        local_110._0_8_ = local_138._M_string_length;
        local_110._8_8_ = local_138._M_dataplus._M_p;
        classname_00._M_str = (char *)local_118;
        classname_00._M_len = (size_t)local_158;
        ReservedNamePrefix_abi_cxx11_(&local_e0,local_150,classname_00,in_R8);
        local_60.piece_._M_len = local_e0._M_string_length;
        local_60.piece_._M_str = local_e0._M_dataplus._M_p;
        local_90.piece_._M_len = (size_t)local_150;
        local_90.piece_._M_str = (char *)local_158;
        local_c0._0_8_ = &DAT_00000004;
        local_c0._8_8_ = ".php";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)local_110,&local_60,&local_90,
                   (AlphaNum *)local_c0,in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00e3b6f8;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_110._0_8_ = &DAT_00000028;
      pcVar4 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)local_110);
      goto LAB_00e3b6c1;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_110._0_8_ = &DAT_00000033;
    pcVar4 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)__return_storage_ptr__,(ulong)local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_110._0_8_;
    builtin_strncpy(pcVar4,"GPBMetadata/Google/Protobuf/Internal/Descriptor.php",0x33);
  }
  __return_storage_ptr__->_M_string_length = local_110._0_8_;
  pcVar4[local_110._0_8_] = '\0';
LAB_00e3b6f8:
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  absl::string_view proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of('/', start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  }
  if (options.is_descriptor) {
    return std::string(kDescriptorMetadataFile);
  }

  // Append directory name.
  absl::string_view file_no_suffix;
  int lastindex = proto_file.find_last_of('.');
  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    absl::string_view php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      absl::StrAppend(&result, php_metadata_namespace);
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        absl::StrAppend(&result, "/");
      }
    }
  } else {
    absl::StrAppend(&result, "GPBMetadata/");
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      absl::StrAppend(&result, ReservedNamePrefix(segment, file), segment, "/");
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of('/', start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of('/');
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start),
      true);

  return absl::StrCat(result, ReservedNamePrefix(segment, file), segment,
                      ".php");
}